

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

void Nwk_ManGraphSolve(Nwk_Grf_t *p)

{
  uint uVar1;
  int iVar2;
  Nwk_Vrt_t *pNVar3;
  ulong uVar4;
  Nwk_Vrt_t *pNext;
  long lVar5;
  bool bVar6;
  
  Nwk_ManGraphPrepare(p);
  do {
    do {
      if (p->pLists1[0] != 0) {
        __assert_fail("p->pLists1[0] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x275,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
      }
      iVar2 = p->pLists1[1];
      bVar6 = true;
      if (iVar2 == 0) {
        uVar4 = 0;
        do {
          if (uVar4 == 0xf) goto LAB_00496b98;
          iVar2 = p->pLists1[uVar4 + 2];
          uVar4 = uVar4 + 1;
        } while (iVar2 == 0);
        bVar6 = uVar4 < 0x10;
      }
      pNVar3 = p->pVerts[iVar2];
      if (pNVar3->nEdges != 1) {
        __assert_fail("pVertex->nEdges == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x27c,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
      }
      Nwk_ManGraphUpdate(p,pNVar3,p->pVerts[pNVar3[1].Id]);
    } while (bVar6);
LAB_00496b98:
    if (p->pLists2[0] != 0) {
      __assert_fail("p->pLists2[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                    ,0x284,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
    }
    if (p->pLists2[1] != 0) {
      __assert_fail("p->pLists2[1] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                    ,0x285,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
    }
    lVar5 = 0x21;
    while (p->pLists1[lVar5 + -0xe] == 0) {
      lVar5 = lVar5 + 1;
      if (lVar5 == 0x30) goto LAB_00496c2f;
    }
    pNVar3 = Nwk_ManGraphListFindMin(p,p->pLists1[lVar5 + -0xe]);
    uVar1 = pNVar3->nEdges;
    if ((lVar5 != 0x2f) && ((int)lVar5 - uVar1 != 0x1f)) {
      __assert_fail("pVertex->nEdges == j || j == NWK_MAX_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                    ,0x28c,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
    }
    if ((int)uVar1 < 1) {
      pNext = (Nwk_Vrt_t *)0x0;
    }
    else {
      uVar4 = 0;
      pNext = (Nwk_Vrt_t *)0x0;
      do {
        if ((pNext == (Nwk_Vrt_t *)0x0) ||
           (p->pVerts[(&pNVar3[1].Id)[uVar4]]->nEdges < pNext->nEdges)) {
          pNext = p->pVerts[(&pNVar3[1].Id)[uVar4]];
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    Nwk_ManGraphUpdate(p,pNVar3,pNext);
  } while (lVar5 != 0x30);
LAB_00496c2f:
  Nwk_ManGraphSortPairs(p);
  return;
}

Assistant:

void Nwk_ManGraphSolve( Nwk_Grf_t * p )
{
    Nwk_Vrt_t * pVertex, * pNext;
    int i, j;
    Nwk_ManGraphPrepare( p );
    while ( 1 )
    {
        // find the next vertex to extract
        assert( p->pLists1[0] == 0 );
        for ( i = 1; i <= NWK_MAX_LIST; i++ )
            if ( p->pLists1[i] )
            {
//                printf( "%d ", i );
//                printf( "ListA = %2d. Length = %5d.\n", i, Nwk_ManGraphListLength(p,p->pLists1[i]) );
                pVertex = p->pVerts[ p->pLists1[i] ];
                assert( pVertex->nEdges == 1 );
                pNext = p->pVerts[ pVertex->pEdges[0] ];
                Nwk_ManGraphUpdate( p, pVertex, pNext );
                break;
            }
        if ( i < NWK_MAX_LIST + 1 )
            continue;
        // find the next vertex to extract
        assert( p->pLists2[0] == 0 );
        assert( p->pLists2[1] == 0 );
        for ( j = 2; j <= NWK_MAX_LIST; j++ )
            if ( p->pLists2[j] )
            {
//                printf( "***%d ", j );
//                printf( "ListB = %2d. Length = %5d.\n", j, Nwk_ManGraphListLength(p,p->pLists2[j]) );
                pVertex = Nwk_ManGraphListFindMin( p, p->pLists2[j] ); 
                assert( pVertex->nEdges == j || j == NWK_MAX_LIST );
                pNext = Nwk_ManGraphListFindMinEdge( p, pVertex );
                Nwk_ManGraphUpdate( p, pVertex, pNext );
                break;
            }
        if ( j == NWK_MAX_LIST + 1 )
            break;
    }
    Nwk_ManGraphSortPairs( p );
}